

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_chunk_append(uchar **out,size_t *outsize,uchar *chunk)

{
  long lVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  uchar *in_RDX;
  size_t *in_RSI;
  long *in_RDI;
  uchar *new_buffer;
  uchar *chunk_start;
  size_t new_length;
  size_t total_chunk_length;
  uint i;
  size_t in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  size_t local_38;
  size_t local_30;
  uint local_24;
  uchar *local_20;
  size_t *local_18;
  long *local_10;
  uint local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar2 = lodepng_chunk_type_name_valid(in_RDX);
  if (uVar2 == '\0') {
    local_4 = 0x79;
  }
  else {
    uVar2 = lodepng_chunk_reserved(local_20);
    if (uVar2 == '\0') {
      uVar3 = lodepng_chunk_length((uchar *)0x346ce3);
      iVar4 = lodepng_addofl((ulong)uVar3,0xc,&local_30);
      if (iVar4 == 0) {
        iVar4 = lodepng_addofl(*local_18,local_30,&local_38);
        if (iVar4 == 0) {
          pvVar5 = lodepng_realloc(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          if (pvVar5 == (void *)0x0) {
            local_4 = 0x53;
          }
          else {
            *local_10 = (long)pvVar5;
            *local_18 = local_38;
            lVar1 = *local_10;
            for (local_24 = 0; local_24 != local_30; local_24 = local_24 + 1) {
              *(uchar *)(lVar1 + (local_38 - local_30) + (ulong)local_24) = local_20[local_24];
            }
            local_4 = 0;
          }
        }
        else {
          local_4 = 0x4d;
        }
      }
      else {
        local_4 = 0x4d;
      }
    }
    else {
      local_4 = 0x7a;
    }
  }
  return local_4;
}

Assistant:

unsigned lodepng_chunk_append(unsigned char** out, size_t* outsize, const unsigned char* chunk) {
  unsigned i;
  size_t total_chunk_length, new_length;
  unsigned char *chunk_start, *new_buffer;

  if(!lodepng_chunk_type_name_valid(chunk)) {
    return 121; /* invalid chunk type name */
  }
  if(lodepng_chunk_reserved(chunk)) {
    return 122; /* invalid third lowercase character */
  }

  if(lodepng_addofl(lodepng_chunk_length(chunk), 12, &total_chunk_length)) return 77;
  if(lodepng_addofl(*outsize, total_chunk_length, &new_length)) return 77;

  new_buffer = (unsigned char*)lodepng_realloc(*out, new_length);
  if(!new_buffer) return 83; /*alloc fail*/
  (*out) = new_buffer;
  (*outsize) = new_length;
  chunk_start = &(*out)[new_length - total_chunk_length];

  for(i = 0; i != total_chunk_length; ++i) chunk_start[i] = chunk[i];

  return 0;
}